

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_outputAndInputParameter_TestShell::
~TEST_MockParameterTest_outputAndInputParameter_TestShell
          (TEST_MockParameterTest_outputAndInputParameter_TestShell *this)

{
  TEST_MockParameterTest_outputAndInputParameter_TestShell *this_local;
  
  ~TEST_MockParameterTest_outputAndInputParameter_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockParameterTest, outputAndInputParameter)
{
    int return_value = 5;
    int returned_value = 7;

    mock().expectOneCall("foo").withParameter("bar", 10).withOutputParameterReturning("bar", &return_value, sizeof(return_value));
    mock().actualCall("foo").withParameter("bar", 10).withOutputParameter("bar", &returned_value);

    LONGS_EQUAL(5, returned_value);
    mock().checkExpectations();
}